

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O1

int cpoly(double *OPR,double *OPI,int DEGREE,double *ZEROR,double *ZEROI)

{
  size_t sVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *QPR;
  double *pdVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 in_register_00000014;
  double dVar11;
  double *pdVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  uint uVar18;
  double *HI;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double *pdVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double *TI_00;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double AR;
  double AI;
  double local_218;
  double pit;
  double *local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  ulong local_1d8;
  int N;
  double local_1c8;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  double local_1b0;
  double ZR;
  double ZI;
  double *local_198;
  size_t local_190;
  double *local_188;
  double *local_180;
  ulong local_178;
  undefined8 local_170;
  double local_168;
  ulong uStack_160;
  double local_158;
  ulong uStack_150;
  double local_148;
  undefined8 uStack_140;
  double *local_130;
  double *local_128;
  undefined8 uStack_120;
  uint local_114;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_cc;
  int iStack_c8;
  int CONV;
  double prt;
  double SR;
  double SI;
  double *local_a8;
  double *local_a0;
  double local_98;
  double local_90;
  long local_88;
  double local_80;
  double TR;
  double TI;
  undefined8 local_68;
  undefined8 uStack_60;
  double *local_50;
  double *local_48;
  ulong local_40;
  bool local_31;
  
  local_170 = CONCAT44(in_register_00000014,DEGREE);
  local_188 = ZEROI;
  local_180 = ZEROR;
  local_128 = OPR;
  local_e8 = OPI;
  pdVar2 = (double *)malloc(800);
  pdVar3 = (double *)malloc(800);
  pdVar4 = (double *)malloc(800);
  local_48 = (double *)malloc(800);
  QPR = (double *)malloc(800);
  local_50 = (double *)malloc(800);
  local_108 = (double *)malloc(800);
  local_100 = (double *)malloc(800);
  TI = (double)malloc(800);
  pdVar5 = (double *)malloc(800);
  SI = macheps();
  local_110 = QPR;
  if ((((*local_128 != 0.0) || (NAN(*local_128))) || (*local_e8 != 0.0)) || (NAN(*local_e8))) {
    uVar18 = (int)local_170 + 1;
    lVar6 = (long)(int)local_170;
    if ((local_128[lVar6] == 0.0) && (!NAN(local_128[lVar6]))) {
      iVar8 = 0;
      while ((local_e8[lVar6] == 0.0 && (!NAN(local_e8[lVar6])))) {
        local_180[iVar8] = 0.0;
        local_188[iVar8] = 0.0;
        lVar7 = lVar6 + -1;
        lVar6 = lVar6 + -1;
        iVar8 = iVar8 + 1;
        if ((local_128[lVar7] != 0.0) || (NAN(local_128[lVar7]))) break;
      }
      uVar18 = uVar18 - iVar8;
    }
    local_178 = (ulong)uVar18;
    dVar11 = TI;
    pdVar17 = local_48;
    local_f8 = pdVar5;
    local_40 = local_178;
    if (0 < (int)uVar18) {
      uVar14 = 0;
      pdVar5 = local_e8;
      pdVar24 = local_128;
      do {
        dVar28 = pdVar24[uVar14];
        pdVar2[uVar14] = dVar28;
        dVar30 = pdVar5[uVar14];
        pdVar3[uVar14] = dVar30;
        dVar28 = ABS(dVar28);
        dVar30 = ABS(dVar30);
        if (dVar30 <= dVar28) {
          if (dVar28 <= dVar30) {
            dVar29 = dVar28 * 1.4142135623730951;
          }
          else {
            dVar29 = (dVar30 / dVar28) * (dVar30 / dVar28) + 1.0;
            if (dVar29 < 0.0) {
              uStack_60 = 0;
              local_68 = dVar28;
              dVar29 = sqrt(dVar29);
              dVar11 = TI;
              pdVar17 = local_48;
              pdVar5 = local_e8;
              pdVar24 = local_128;
              dVar28 = local_68;
            }
            else {
              dVar29 = SQRT(dVar29);
            }
            dVar29 = dVar29 * dVar28;
          }
        }
        else {
          dVar29 = (dVar28 / dVar30) * (dVar28 / dVar30) + 1.0;
          if (dVar29 < 0.0) {
            uStack_60 = 0;
            local_68 = dVar30;
            dVar29 = sqrt(dVar29);
            dVar11 = TI;
            pdVar17 = local_48;
            pdVar5 = local_e8;
            pdVar24 = local_128;
            dVar30 = local_68;
          }
          else {
            dVar29 = SQRT(dVar29);
          }
          dVar29 = dVar29 * dVar30;
        }
        *(double *)((long)dVar11 + uVar14 * 8) = dVar29;
        uVar14 = uVar14 + 1;
      } while (local_40 != uVar14);
    }
    iVar8 = (int)local_178;
    if (iVar8 < 1) {
      dVar28 = 1.79769313486232e+308;
      uVar20 = 0;
      uVar22 = 0;
    }
    else {
      uVar14 = 0;
      dVar30 = 0.0;
      dVar29 = 1.79769313486232e+308;
      do {
        dVar26 = *(double *)((long)dVar11 + uVar14 * 8);
        uVar20 = SUB84(dVar26,0);
        uVar22 = (undefined4)((ulong)dVar26 >> 0x20);
        dVar28 = dVar26;
        if (dVar26 == 0.0 || dVar29 <= dVar26) {
          dVar28 = dVar29;
        }
        if (dVar26 <= dVar30) {
          uVar20 = SUB84(dVar30,0);
          uVar22 = (undefined4)((ulong)dVar30 >> 0x20);
        }
        uVar14 = uVar14 + 1;
        dVar30 = (double)CONCAT44(uVar22,uVar20);
        dVar29 = dVar28;
      } while (local_40 != uVar14);
    }
    if ((dVar28 < 2.2250738585072014e-308 / SI) ||
       (1.3407807929942596e+154 < (double)CONCAT44(uVar22,uVar20))) {
      dVar11 = (2.2250738585072014e-308 / SI) / dVar28;
      if (dVar11 <= 1.0) {
        if ((double)CONCAT44(uVar22,uVar20) < 0.0) {
          local_68 = dVar28;
          dVar11 = sqrt((double)CONCAT44(uVar22,uVar20));
          dVar28 = local_68;
        }
        else {
          dVar11 = SQRT((double)CONCAT44(uVar22,uVar20));
        }
        if (dVar28 < 0.0) {
          local_68 = dVar11;
          dVar28 = sqrt(dVar28);
          dVar11 = local_68;
        }
        else {
          dVar28 = SQRT(dVar28);
        }
        dVar11 = 1.0 / (dVar11 * dVar28);
      }
      else if ((double)CONCAT44(uVar22,uVar20) <= 1.79769313486232e+308 / dVar11 &&
               1.79769313486232e+308 / dVar11 != (double)CONCAT44(uVar22,uVar20)) {
        dVar11 = 1.0;
      }
      dVar11 = log(dVar11);
      dVar11 = exp2(dVar11 / 0.6931471805599453 + 0.5);
      uVar20 = SUB84(dVar11,0);
      uVar22 = (undefined4)((ulong)dVar11 >> 0x20);
      pdVar17 = local_48;
    }
    else {
      uVar20 = 0;
      uVar22 = 0x3ff00000;
    }
    if (0 < iVar8 && (double)CONCAT44(uVar22,uVar20) != 1.0) {
      uVar14 = 0;
      do {
        pdVar2[uVar14] = pdVar2[uVar14] * (double)CONCAT44(uVar22,uVar20);
        pdVar3[uVar14] = pdVar3[uVar14] * (double)CONCAT44(uVar22,uVar20);
        uVar14 = uVar14 + 1;
      } while (local_40 != uVar14);
    }
    local_31 = iVar8 < 3;
    if (iVar8 < 3) {
LAB_0012b25c:
      _iStack_c8 = -pdVar2[1];
      local_218 = -pdVar3[1];
      CDIVID((double *)&stack0xffffffffffffff38,&local_218,pdVar2,pdVar3,1.79769313486232e+308,
             local_180 + (long)(int)local_170 + -1,local_188 + (long)(int)local_170 + -1);
      iVar8 = 0;
      pdVar5 = local_f8;
      goto LAB_0012b2d2;
    }
    local_200 = SI * 2.8284271247461903;
    dVar11 = SI * 10.0;
    local_1b4 = (int)local_170 + 1;
    local_114 = iVar8 - 1;
    uVar9 = (ulong)local_114;
    local_178 = (ulong)(iVar8 - 2);
    lVar6 = -local_40;
    local_a8 = pdVar17 + local_40;
    local_a0 = pdVar4 + local_40;
    _N = local_40 - 2;
    local_1e0 = -0.70710678;
    local_1e8 = 0.70710678;
    uVar14 = 0;
    ZI = (double)pdVar2;
    local_198 = pdVar3;
    local_130 = pdVar4;
LAB_0012a2c5:
    local_190 = (uVar9 - uVar14) * 8;
    uVar15 = 0;
    dVar28 = TI;
    uVar10 = local_40;
    local_88 = lVar6;
    do {
      dVar30 = ABS(pdVar2[uVar15]);
      dVar29 = ABS(pdVar3[uVar15]);
      if (dVar29 <= dVar30) {
        if (dVar30 <= dVar29) {
          dVar26 = dVar30 * 1.4142135623730951;
        }
        else {
          dVar26 = (dVar29 / dVar30) * (dVar29 / dVar30) + 1.0;
          if (dVar26 < 0.0) {
            uStack_60 = 0;
            local_68 = dVar30;
            dVar26 = sqrt(dVar26);
            dVar28 = TI;
            uVar10 = local_40;
            dVar30 = local_68;
          }
          else {
            dVar26 = SQRT(dVar26);
          }
          dVar26 = dVar26 * dVar30;
        }
      }
      else {
        dVar26 = (dVar30 / dVar29) * (dVar30 / dVar29) + 1.0;
        if (dVar26 < 0.0) {
          uStack_60 = 0;
          local_68 = dVar29;
          dVar26 = sqrt(dVar26);
          dVar28 = TI;
          uVar10 = local_40;
          dVar29 = local_68;
        }
        else {
          dVar26 = SQRT(dVar26);
        }
        dVar26 = dVar26 * dVar29;
      }
      *(double *)((long)dVar28 + uVar15 * 8) = dVar26;
      uVar15 = uVar15 + 1;
    } while (uVar10 != uVar15);
    local_128 = *(double **)((long)dVar28 + -8 + uVar10 * 8);
    *(ulong *)((long)dVar28 + -8 + uVar10 * 8) = (ulong)local_128 ^ 0x8000000000000000;
    uStack_120 = 0;
    local_e8 = (double *)log((double)local_128);
    local_68 = *(double *)TI;
    dVar28 = log(local_68);
    local_1c8 = (double)(int)(uVar10 - 1);
    local_1d8 = uVar10 - 1;
    local_f0 = exp(((double)local_e8 - dVar28) / local_1c8);
    dVar28 = *(double *)((long)TI + -0x10 + local_40 * 8);
    if (((dVar28 != 0.0) || (NAN(dVar28))) && ((double)local_128 / dVar28 < local_f0)) {
      local_f0 = (double)local_128 / dVar28;
    }
    uVar20 = SUB84(local_1c8,0);
    uVar22 = (undefined4)((ulong)local_1c8 >> 0x20);
    if (0.0 < local_68) {
      uVar18 = 0;
      do {
        local_f0 = local_f0 * 0.1;
        uVar10 = 1;
        dVar28 = local_68;
        do {
          dVar28 = dVar28 * local_f0 + *(double *)((long)TI + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (local_40 != uVar10);
      } while ((0.0 < dVar28) && (bVar19 = uVar18 < 999, uVar18 = uVar18 + 1, bVar19));
    }
    if (0.005 < ABS(local_f0 / local_f0)) {
      uVar18 = 0;
      do {
        *local_f8 = local_68;
        uVar10 = 1;
        dVar28 = local_68;
        do {
          dVar28 = dVar28 * local_f0 + *(double *)((long)TI + uVar10 * 8);
          local_f8[uVar10] = dVar28;
          uVar10 = uVar10 + 1;
        } while (local_40 != uVar10);
        uVar10 = 2;
        dVar28 = local_68;
        do {
          dVar28 = dVar28 * local_f0 + local_f8[uVar10 - 1];
          uVar10 = uVar10 + 1;
        } while (local_40 != uVar10);
        local_f0 = local_f0 - local_f8[local_1d8] / dVar28;
      } while ((0.005 < ABS((local_f8[local_1d8] / dVar28) / local_f0)) &&
              (bVar19 = uVar18 < 999, uVar18 = uVar18 + 1, bVar19));
    }
    pit = (double)(pdVar4 + (local_40 - 2));
    local_208 = local_48 + (local_40 - 2);
    pdVar24 = (double *)ABS(pdVar2[local_40 - 2]);
    TI_00 = (double *)ABS(pdVar3[local_40 - 2]);
    dVar28 = (double)pdVar24 * 1.4142135623730951;
    local_1f8 = *pdVar2;
    local_1f0 = *pdVar3;
    pdVar17 = TI_00;
    if ((double)TI_00 <= (double)pdVar24) {
      pdVar17 = pdVar24;
    }
    dVar30 = (double)(~-(ulong)((double)pdVar24 < (double)TI_00) &
                      (ulong)(((double)TI_00 / (double)pdVar24) * ((double)TI_00 / (double)pdVar24))
                     | (ulong)(((double)pdVar24 / (double)TI_00) * ((double)pdVar24 / (double)TI_00)
                              ) & -(ulong)((double)pdVar24 < (double)TI_00)) + 1.0;
    iVar8 = 1;
    do {
      lVar6 = 1;
      uVar18 = local_114;
      do {
        pdVar4[lVar6 + -1] =
             (pdVar2[lVar6 + -1] * (double)(int)uVar18) / (double)CONCAT44(uVar22,uVar20);
        local_48[lVar6 + -1] =
             ((double)(int)uVar18 * pdVar3[lVar6 + -1]) / (double)CONCAT44(uVar22,uVar20);
        lVar6 = lVar6 + 1;
        uVar18 = uVar18 - 1;
      } while (local_88 + lVar6 != 0);
      iVar13 = 0;
      pdVar5 = local_a8;
      pdVar12 = local_a0;
      pdVar16 = local_50;
      uVar10 = local_40;
      lVar6 = local_88;
      HI = local_48;
      dVar29 = local_f0;
      local_1b8 = iVar8;
      do {
        dVar26 = ABS(*(double *)pit);
        dVar25 = ABS(*local_208);
        if (dVar25 <= dVar26) {
          if (dVar26 <= dVar25) {
            dVar27 = dVar26 * 1.4142135623730951;
          }
          else {
            dVar27 = (dVar25 / dVar26) * (dVar25 / dVar26) + 1.0;
            if (dVar27 < 0.0) {
              uStack_60 = 0;
              local_68 = dVar26;
              dVar27 = sqrt(dVar27);
              pdVar5 = local_a8;
              pdVar12 = local_a0;
              pdVar16 = local_50;
              uVar10 = local_40;
              lVar6 = local_88;
              HI = local_48;
              dVar29 = local_f0;
              dVar26 = local_68;
            }
            else {
              dVar27 = SQRT(dVar27);
            }
            dVar27 = dVar27 * dVar26;
          }
        }
        else {
          dVar27 = (dVar26 / dVar25) * (dVar26 / dVar25) + 1.0;
          if (dVar27 < 0.0) {
            uStack_60 = 0;
            local_68 = dVar25;
            dVar27 = sqrt(dVar27);
            pdVar5 = local_a8;
            pdVar12 = local_a0;
            pdVar16 = local_50;
            uVar10 = local_40;
            lVar6 = local_88;
            HI = local_48;
            dVar29 = local_f0;
            dVar25 = local_68;
          }
          else {
            dVar27 = SQRT(dVar27);
          }
          dVar27 = dVar27 * dVar25;
        }
        dVar26 = dVar28;
        if ((double)pdVar24 != (double)TI_00) {
          dVar26 = SQRT(dVar30);
          if (dVar30 < 0.0) {
            local_68 = dVar27;
            dVar26 = sqrt(dVar30);
            pdVar5 = local_a8;
            pdVar12 = local_a0;
            pdVar16 = local_50;
            uVar10 = local_40;
            lVar6 = local_88;
            HI = local_48;
            dVar29 = local_f0;
            dVar27 = local_68;
          }
          dVar26 = dVar26 * (double)pdVar17;
        }
        if (dVar27 <= dVar26 * dVar11) {
          uVar20 = 0;
          uVar22 = 0;
          if ((local_31 & 1U) == 0) {
            lVar7 = -2;
            do {
              pdVar12[lVar7] = pdVar12[lVar7 + -1];
              pdVar5[lVar7] = pdVar5[lVar7 + -1];
              lVar7 = lVar7 + -1;
            } while (lVar6 != lVar7);
          }
          uVar21 = 0;
          uVar23 = 0;
        }
        else {
          local_68 = *pdVar2;
          uStack_60 = 0;
          _iStack_c8 = -local_68;
          local_e8 = (double *)*pdVar3;
          uStack_e0 = 0;
          local_218 = -(double)local_e8;
          CDIVID((double *)&stack0xffffffffffffff38,&local_218,(double *)pit,local_208,
                 1.79769313486232e+308,&local_80,&TR);
          if ((local_31 & 1U) == 0) {
            lVar6 = _N;
            do {
              dVar29 = local_48[lVar6 + -1];
              pdVar4[lVar6] = local_80 * pdVar4[lVar6 + -1] + dVar29 * -TR + pdVar2[lVar6];
              local_48[lVar6] = dVar29 * local_80 + pdVar4[lVar6 + -1] * TR + pdVar3[lVar6];
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          pdVar5 = local_a8;
          pdVar12 = local_a0;
          pdVar16 = local_50;
          uVar10 = local_40;
          lVar6 = local_88;
          HI = local_48;
          uVar21 = (int)local_e8;
          uVar23 = local_e8._4_4_;
          uVar20 = (int)local_68;
          uVar22 = local_68._4_4_;
          dVar29 = local_f0;
        }
        *pdVar4 = (double)CONCAT44(uVar22,uVar20);
        *HI = (double)CONCAT44(uVar23,uVar21);
        iVar13 = iVar13 + 1;
      } while (iVar13 != 5);
      iVar8 = 1;
      do {
        dVar26 = local_1e8 * -0.060756474 + local_1e0 * -0.99756405;
        local_1e0 = local_1e8 * 0.99756405 + local_1e0 * -0.060756474;
        prt = dVar29 * dVar26;
        SR = dVar29 * local_1e0;
        *QPR = local_1f8;
        *pdVar16 = local_1f0;
        uVar15 = 1;
        local_90 = local_1f0;
        dVar29 = local_1f8;
        do {
          local_98 = (dVar29 * prt - SR * local_90) + pdVar2[uVar15];
          local_90 = local_90 * prt + dVar29 * SR + pdVar3[uVar15];
          QPR[uVar15] = local_98;
          pdVar16[uVar15] = local_90;
          uVar15 = uVar15 + 1;
          dVar29 = local_98;
        } while (uVar10 != uVar15);
        local_1c0 = iVar8 * 10;
        local_1e8 = dVar26;
        CALCT(&stack0xffffffffffffff38,(int)uVar10,&prt,&SR,pdVar4,HI,local_108,local_100,SI,
              1.79769313486232e+308,&local_98,&local_90,&local_80,&TR);
        local_1bc = iVar8 * 10 + -1;
        local_128 = (double *)CONCAT44(local_128._4_4_,1);
        iVar13 = 0;
        local_e8 = (double *)((ulong)local_e8 & 0xffffffff00000000);
        do {
          pdVar5 = local_48;
          pdVar4 = local_100;
          pdVar3 = local_108;
          pdVar2 = local_130;
          local_68 = (double)CONCAT44(local_68._4_4_,iVar13);
          local_158 = local_80;
          local_168 = TR;
          iVar13 = (int)local_40;
          NEXTH(&stack0xffffffffffffff38,iVar13,local_108,local_100,QPR,local_50,&local_80,&TR,
                local_130,local_48);
          CALCT(&stack0xffffffffffffff38,iVar13,&prt,&SR,pdVar2,pdVar5,pdVar3,pdVar4,SI,
                1.79769313486232e+308,&local_98,&local_90,&local_80,&TR);
          dVar26 = SR;
          dVar29 = prt;
          QPR = local_110;
          dVar27 = prt + local_80;
          uVar15 = 0;
          uVar10 = 0;
          dVar25 = SR + TR;
          iVar13 = (int)local_68;
          uVar20 = (int)local_e8;
          local_1b0 = dVar27;
          ZR = dVar25;
          if ((int)local_128 != 0 && iStack_c8 != 1) {
            local_128 = (double *)CONCAT44(local_128._4_4_,1);
            if ((int)local_68 != local_1bc) {
              dVar31 = ABS(local_80 - local_158);
              dVar33 = ABS(TR - local_168);
              if (dVar33 <= dVar31) {
                if (dVar31 <= dVar33) {
                  dVar32 = dVar31 * 1.4142135623730951;
                }
                else {
                  dVar32 = (dVar33 / dVar31) * (dVar33 / dVar31) + 1.0;
                  if (dVar32 < 0.0) {
                    uStack_150 = 0;
                    uStack_160 = 0;
                    uStack_140 = 0;
                    local_168 = dVar25;
                    local_158 = dVar27;
                    local_148 = dVar31;
                    dVar32 = sqrt(dVar32);
                    dVar25 = local_168;
                    uVar10 = uStack_160;
                    dVar31 = local_148;
                    dVar27 = local_158;
                    uVar15 = uStack_150;
                  }
                  else {
                    dVar32 = SQRT(dVar32);
                  }
                  dVar32 = dVar32 * dVar31;
                }
              }
              else {
                dVar32 = (dVar31 / dVar33) * (dVar31 / dVar33) + 1.0;
                if (dVar32 < 0.0) {
                  uStack_150 = 0;
                  uStack_160 = 0;
                  uStack_140 = 0;
                  local_168 = dVar25;
                  local_158 = dVar27;
                  local_148 = dVar33;
                  dVar32 = sqrt(dVar32);
                  dVar25 = local_168;
                  uVar10 = uStack_160;
                  dVar33 = local_148;
                  dVar27 = local_158;
                  uVar15 = uStack_150;
                }
                else {
                  dVar32 = SQRT(dVar32);
                }
                dVar32 = dVar32 * dVar33;
              }
              dVar27 = ABS(dVar27);
              dVar25 = ABS(dVar25);
              if (dVar25 <= dVar27) {
                if (dVar27 <= dVar25) {
                  dVar31 = dVar27 * 1.4142135623730951;
                }
                else {
                  dVar31 = (dVar25 / dVar27) * (dVar25 / dVar27) + 1.0;
                  if (dVar31 < 0.0) {
                    local_158 = dVar27;
                    uStack_150 = uVar15 & 0x7fffffffffffffff;
                    local_148 = dVar32;
                    dVar31 = sqrt(dVar31);
                    dVar32 = local_148;
                    dVar27 = local_158;
                  }
                  else {
                    dVar31 = SQRT(dVar31);
                  }
                  dVar31 = dVar31 * dVar27;
                }
              }
              else {
                dVar31 = (dVar27 / dVar25) * (dVar27 / dVar25) + 1.0;
                if (dVar31 < 0.0) {
                  local_168 = dVar25;
                  uStack_160 = uVar10 & 0x7fffffffffffffff;
                  local_148 = dVar32;
                  dVar31 = sqrt(dVar31);
                  dVar25 = local_168;
                  dVar32 = local_148;
                }
                else {
                  dVar31 = SQRT(dVar31);
                }
                dVar31 = dVar31 * dVar25;
              }
              pdVar2 = local_130;
              sVar1 = local_190;
              uVar20 = 0;
              if (dVar32 < dVar31 * 0.5) {
                uVar20 = 1;
                if ((int)local_e8 == 1) {
                  memcpy((void *)TI,local_130,local_190);
                  pdVar3 = local_48;
                  memcpy(local_f8,local_48,sVar1);
                  QPR = local_110;
                  VRSHFT((int)local_40,(int)&local_1b0,&ZR,(double *)&local_cc,(int *)&prt,&SR,
                         (double *)ZI,local_198,local_110,local_50,&local_98,&local_90,pdVar2,SI,
                         local_200,SI,1.79769313486232e+308,pdVar3,local_108,local_100,&local_80,&TR
                         ,pdVar24,(double *)0x0,TI_00);
                  pdVar2 = local_130;
                  sVar1 = local_190;
                  if (local_cc == 1) break;
                  memcpy(local_130,(void *)TI,local_190);
                  memcpy(local_48,local_f8,sVar1);
                  *QPR = local_1f8;
                  *local_50 = local_1f0;
                  uVar10 = 1;
                  dVar25 = local_1f8;
                  local_90 = local_1f0;
                  do {
                    local_98 = (dVar25 * dVar29 - dVar26 * local_90) +
                               *(double *)((long)ZI + uVar10 * 8);
                    local_90 = local_90 * dVar29 + dVar25 * dVar26 + local_198[uVar10];
                    QPR[uVar10] = local_98;
                    local_50[uVar10] = local_90;
                    uVar10 = uVar10 + 1;
                    dVar25 = local_98;
                  } while (local_40 != uVar10);
                  prt = dVar29;
                  SR = dVar26;
                  CALCT(&stack0xffffffffffffff38,(int)local_40,&prt,&SR,pdVar2,local_48,local_108,
                        local_100,SI,1.79769313486232e+308,&local_98,&local_90,&local_80,&TR);
                  local_128 = (double *)((ulong)local_128 & 0xffffffff00000000);
                }
                else {
                  local_128 = (double *)CONCAT44(local_128._4_4_,1);
                }
              }
            }
          }
          iVar13 = iVar13 + 1;
          local_e8 = (double *)CONCAT44(local_e8._4_4_,uVar20);
        } while (iVar13 != local_1c0);
        pdVar4 = local_130;
        pdVar3 = local_198;
        pdVar2 = (double *)ZI;
        VRSHFT((int)local_40,(int)&local_1b0,&ZR,(double *)&local_cc,(int *)&prt,&SR,(double *)ZI,
               local_198,QPR,local_50,&local_98,&local_90,local_130,SI,local_200,SI,
               1.79769313486232e+308,local_48,local_108,local_100,&local_80,&TR,pdVar24,
               (double *)0x0,TI_00);
        sVar1 = local_190;
        if (local_cc == 1) {
          local_180[local_1b4 - (int)local_40] = local_1b0;
          local_188[local_1b4 - (int)local_40] = ZR;
          memcpy(pdVar2,QPR,local_190);
          memcpy(pdVar3,local_50,sVar1);
          local_31 = (long)local_40 < 4;
          uVar14 = uVar14 + 1;
          lVar6 = local_88 + 1;
          local_114 = local_114 - 1;
          local_a8 = local_a8 + -1;
          local_a0 = local_a0 + -1;
          _N = _N + -1;
          local_40 = local_1d8;
          if (uVar14 != local_178) goto LAB_0012a2c5;
          goto LAB_0012b25c;
        }
        iVar8 = iVar8 + 1;
        pdVar16 = local_50;
        uVar10 = local_40;
        HI = local_48;
        dVar29 = local_f0;
      } while (iVar8 != 10);
      iVar8 = local_1b8 + 1;
      uVar20 = SUB84(local_1c8,0);
      uVar22 = (undefined4)((ulong)local_1c8 >> 0x20);
      pdVar5 = local_f8;
    } while (iVar8 != 3);
  }
  iVar8 = 1;
LAB_0012b2d2:
  free(pdVar2);
  free(pdVar3);
  free(pdVar4);
  free(local_48);
  free(local_110);
  free(local_50);
  free(local_108);
  free(local_100);
  free((void *)TI);
  free(pdVar5);
  return iVar8;
}

Assistant:

int cpoly(double *OPR, double *OPI, int DEGREE, double *ZEROR, double *ZEROI) {
	/* FINDS THE ZEROS OF A COMPLEX POLYNOMIAL.
	C OPR, OPI  -  DOUBLE PRECISION VECTORS OF REAL AND
	C IMAGINARY PARTS OF THE COEFFICIENTS IN
	C ORDER OF DECREASING POWERS.
	C DEGREE    -  INTEGER DEGREE OF POLYNOMIAL.
	C ZEROR, ZEROI  -  OUTPUT DOUBLE PRECISION VECTORS OF
	C REAL AND IMAGINARY PARTS OF THE ZEROS.
	C FAIL      -  OUTPUT LOGICAL PARAMETER,  TRUE  ONLY IF
	C LEADING COEFFICIENT IS ZERO OR IF CPOLY
	C HAS FOUND FEWER THAN DEGREE ZEROS.
	C THE PROGRAM HAS BEEN WRITTEN TO REDUCE THE CHANCE OF OVERFLOW
	C OCCURRING. IF IT DOES OCCUR, THERE IS STILL A POSSIBILITY THAT
	C THE ZEROFINDER WILL WORK PROVIDED THE OVERFLOWED QUANTITY IS
	C REPLACED BY A LARGE NUMBER.*/
	int fail,CONV;
	double *PR, *PI, *HR, *HI, *QPR, *QPI, *QHR, *QHI, *SHR, *SHI;
	double SR, SI, TR, TI, PVR, PVI, ARE, MRE, ETA, INFIN;
	double XX, YY, COSR, SINR, SMALNO, BASE, XXX, ZR, ZI, BND;
	int NN,CNT1,CNT2,IDNN2,i;
	double prt, pit;

	PR = (double*)malloc(sizeof(double)* 100);
	PI = (double*)malloc(sizeof(double)* 100);
	HR = (double*)malloc(sizeof(double)* 100);
	HI = (double*)malloc(sizeof(double)* 100);
	QPR = (double*)malloc(sizeof(double)* 100);
	QPI = (double*)malloc(sizeof(double)* 100);
	QHR = (double*)malloc(sizeof(double)* 100);
	QHI = (double*)malloc(sizeof(double)* 100);
	SHR = (double*)malloc(sizeof(double)* 100);
	SHI = (double*)malloc(sizeof(double)* 100);

	mcon(&ETA, &INFIN, &SMALNO, &BASE);

	ARE = ETA;
	MRE = 2.0*sqrt(2.0)*ETA;
	XX = .70710678;
	YY = -XX;
	COSR = -.060756474;
	SINR = .99756405;
	fail = 0;
	NN = DEGREE + 1;

	if (!(OPR[0] != 0.0 || OPI[0] != 0.0)) {
		fail = 1;
		free(PR);
		free(PI);
		free(HR);
		free(HI);
		free(QPR);
		free(QPI);
		free(QHR);
		free(QHI);
		free(SHR);
		free(SHI);
		return fail;
	}

	while (!(OPR[NN - 1] != 0.0 || OPI[NN - 1] != 0.0)) {
		IDNN2 = DEGREE - NN + 2;
		ZEROR[IDNN2 - 1] = 0.0;
		ZEROI[IDNN2 - 1] = 0.0;
		NN = NN - 1;
	}

	for (i = 0; i < NN; ++i) {
		PR[i] = OPR[i];
		PI[i] = OPI[i];
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = RESCALE(NN, SHR, ETA, INFIN, SMALNO, BASE);

	if (BND != 1.0) {
		for (i = 0; i < NN; ++i) {
			PR[i] = BND*PR[i];
			PI[i] = BND*PI[i];
		}
	}

	NNITER: if (NN <= 2) {
				prt = -1.0 * PR[1];
				pit = -1.0 * PI[1];
				CDIVID(&prt, &pit, &PR[0], &PI[0], INFIN, &ZEROR[DEGREE - 1], &ZEROI[DEGREE - 1]);
				free(PR);
				free(PI);
				free(HR);
				free(HI);
				free(QPR);
				free(QPI);
				free(QHR);
				free(QHI);
				free(SHR);
				free(SHI);
				return fail;
			}

	for (i = 0; i < NN; ++i) {
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = CAUCHY(NN, SHR, SHI);

	/*
	C OUTER LOOP TO CONTROL 2 MAJOR PASSES WITH DIFFERENT SEQUENCES
	C OF SHIFTS.
	*/

	for (CNT1 = 1; CNT1 <= 2; ++CNT1) {
		//C FIRST STAGE CALCULATION, NO SHIFT.
		NOSHFT(NN, 5, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
		//C INNER LOOP TO SELECT A SHIFT.
		for (CNT2 = 1; CNT2 <= 9; ++CNT2) {
			//C SHIFT IS CHOSEN WITH MODULUS BND AND AMPLITUDE ROTATED BY
			//C 94 DEGREES FROM THE PREVIOUS SHIFT
			XXX = COSR*XX - SINR*YY;
			YY = SINR*XX + COSR*YY;
			XX = XXX;
			SR = BND*XX;
			SI = BND*YY;
			//C SECOND STAGE CALCULATION, FIXED SHIFT.
			FXSHFT(NN, 10*CNT2, &ZR, &ZI, &CONV, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
			if (CONV == 1) {
				//C THE SECOND STAGE JUMPS DIRECTLY TO THE THIRD STAGE ITERATION.
				//C IF SUCCESSFUL THE ZERO IS STORED AND THE POLYNOMIAL DEFLATED.
				IDNN2 = DEGREE - NN + 2;
				ZEROR[IDNN2 - 1] = ZR;
				ZEROI[IDNN2 - 1] = ZI;
				NN = NN - 1;
				for (i = 0; i < NN; ++i) {
					PR[i] = QPR[i];
					PI[i] = QPI[i];
				}
				goto NNITER;
			}//80
		}
	}

	fail = 1;

	free(PR);
	free(PI);
	free(HR);
	free(HI);
	free(QPR);
	free(QPI);
	free(QHR);
	free(QHI);
	free(SHR);
	free(SHI);
	return fail;
}